

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

PolymorphicInlineCacheInfo * __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::EnsureInlineeInfo
          (EntryPointPolymorphicInlineCacheInfo *this,Recycler *recycler,
          FunctionBody *inlineeFunctionBody)

{
  Recycler *alloc;
  PolymorphicInlineCacheInfo *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  data._32_8_ = GetInlineeInfo(this,inlineeFunctionBody);
  if ((PolymorphicInlineCacheInfo *)data._32_8_ == (PolymorphicInlineCacheInfo *)0x0) {
    local_50 = (undefined1  [8])&PolymorphicInlineCacheInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x1fc4;
    alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
    this_00 = (PolymorphicInlineCacheInfo *)new<Memory::Recycler>(0x20,alloc,0x37a1d4);
    PolymorphicInlineCacheInfo::PolymorphicInlineCacheInfo(this_00,inlineeFunctionBody);
    data._32_8_ = this_00;
    SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Prepend
              (&(this->inlineeInfo).
                super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>,
               (PolymorphicInlineCacheInfo **)&data.line);
  }
  return (PolymorphicInlineCacheInfo *)data._32_8_;
}

Assistant:

PolymorphicInlineCacheInfo * EntryPointPolymorphicInlineCacheInfo::EnsureInlineeInfo(Recycler * recycler, FunctionBody * inlineeFunctionBody)
    {
        PolymorphicInlineCacheInfo * info = GetInlineeInfo(inlineeFunctionBody);
        if (!info)
        {
            info = RecyclerNew(recycler, PolymorphicInlineCacheInfo, inlineeFunctionBody);
            inlineeInfo.Prepend(info);
        }
        return info;
    }